

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

Result __thiscall
wabt::ReadFile(wabt *this,string_view filename,
              vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  FILE *__stream;
  bool bVar1;
  Result RVar2;
  int iVar3;
  FILE *pFVar4;
  size_type_conflict __new_size;
  size_t sVar5;
  int *piVar6;
  char *pcVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string filename_str;
  string_view filename_local;
  stat statbuf;
  
  out_data_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)filename._M_str;
  filename_local._M_str = (char *)filename._M_len;
  filename_local._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&filename_str,&filename_local,(allocator<char> *)&statbuf);
  __x._M_str = filename_local._M_str;
  __x._M_len = filename_local._M_len;
  __y._M_str = "-";
  __y._M_len = 1;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    RVar2 = ReadAll(_stdin,"stdin",out_data_00);
    goto LAB_00118c64;
  }
  iVar3 = stat(filename_str._M_dataplus._M_p,(stat *)&statbuf);
  if (iVar3 < 0) {
LAB_00118bc9:
    pFVar4 = _stderr;
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    fprintf(pFVar4,"%s: %s\n",filename_str._M_dataplus._M_p,pcVar7);
  }
  else if ((statbuf.st_mode._1_1_ & 0x40) == 0) {
    pFVar4 = fopen(filename_str._M_dataplus._M_p,"rb");
    if (pFVar4 == (FILE *)0x0) goto LAB_00118bc9;
    iVar3 = fseek(pFVar4,0,2);
    if (iVar3 < 0) {
      RVar2 = ReadAll((FILE *)pFVar4,filename_str._M_dataplus._M_p,out_data_00);
      fclose(pFVar4);
      goto LAB_00118c64;
    }
    __new_size = ftell(pFVar4);
    if ((long)__new_size < 0) {
      pcVar7 = "ftell failed";
LAB_00118c25:
      perror(pcVar7);
    }
    else {
      iVar3 = fseek(pFVar4,0,0);
      if (iVar3 < 0) {
        pcVar7 = "fseek to beginning failed";
        goto LAB_00118c25;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out_data_00,__new_size);
      if (__new_size == 0) {
LAB_00118ba0:
        fclose(pFVar4);
        RVar2.enum_ = Ok;
        goto LAB_00118c64;
      }
      sVar5 = fread((out_data_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                    ._M_impl.super__Vector_impl_data._M_start,__new_size,1,pFVar4);
      __stream = _stderr;
      if (sVar5 == 1) goto LAB_00118ba0;
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      fprintf(__stream,"%s: fread failed: %s\n",filename_str._M_dataplus._M_p,pcVar7);
    }
    fclose(pFVar4);
  }
  else {
    fprintf(_stderr,"%s: is a directory\n",filename_str._M_dataplus._M_p);
  }
  RVar2.enum_ = Error;
LAB_00118c64:
  std::__cxx11::string::_M_dispose();
  return (Result)RVar2.enum_;
}

Assistant:

Result ReadFile(std::string_view filename, std::vector<uint8_t>* out_data) {
  std::string filename_str(filename);
  const char* filename_cstr = filename_str.c_str();

  if (filename == "-") {
    return ReadAll(stdin, "stdin", out_data);
  }

  struct stat statbuf;
  if (stat(filename_cstr, &statbuf) < 0) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (statbuf.st_mode & S_IFDIR) {
    fprintf(stderr, "%s: is a directory\n", filename_cstr);
    return Result::Error;
  }

  FILE* infile = fopen(filename_cstr, "rb");
  if (!infile) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_END) < 0) {
    // not seekable, so we can't pre-allocate out_data, but let's try and read
    // it anyway (for pipes, sockets, etc.)
    auto res = ReadAll(infile, filename_cstr, out_data);
    fclose(infile);
    return res;
  }

  long size = ftell(infile);
  if (size < 0) {
    perror("ftell failed");
    fclose(infile);
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_SET) < 0) {
    perror("fseek to beginning failed");
    fclose(infile);
    return Result::Error;
  }

  out_data->resize(size);
  if (size != 0 && fread(out_data->data(), size, 1, infile) != 1) {
    fprintf(stderr, "%s: fread failed: %s\n", filename_cstr, strerror(errno));
    fclose(infile);
    return Result::Error;
  }

  fclose(infile);
  return Result::Ok;
}